

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WLANOptimizer.cpp
# Opt level: O0

void __thiscall WLANOptimizerThread::Loop(WLANOptimizerThread *this)

{
  bool bVar1;
  unique_lock<std::mutex> locker;
  int optimizeResult;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  mutex_type *in_stack_fffffffffffffa48;
  LogStringBuffer *in_stack_fffffffffffffa50;
  Channel *in_stack_fffffffffffffa58;
  Channel *in_stack_fffffffffffffa70;
  unique_lock<std::mutex> *in_stack_fffffffffffffa78;
  condition_variable *in_stack_fffffffffffffa80;
  LogStringBuffer *in_stack_fffffffffffffa88;
  OutputWorker *in_stack_fffffffffffffa90;
  Channel *pCVar2;
  LogStringBuffer *this_00;
  int local_524 [3];
  int *local_518;
  char *local_510;
  Channel *local_508;
  char *local_500;
  Channel *local_4f8;
  int *local_4f0;
  char *local_4e8;
  undefined4 local_4dc;
  Channel *local_4d8;
  undefined4 local_4cc;
  Channel *local_4c8;
  undefined1 local_4b0 [16];
  ostream aoStack_4a0 [376];
  int *local_328;
  char *local_320;
  undefined4 local_314;
  Channel *local_310;
  int *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  LogStringBuffer *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  LogStringBuffer *local_2d0;
  int *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  LogStringBuffer *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  undefined1 *local_290;
  LogStringBuffer *local_288;
  int *local_280;
  undefined1 *local_278;
  LogStringBuffer *local_270;
  char *local_268;
  undefined1 *local_260;
  int *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  Channel *local_58;
  string *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffa58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_524[0] = OptimizeWLAN((int)((ulong)in_stack_fffffffffffffa50 >> 0x20));
    if (2 < local_524[0]) break;
    if (local_524[0] == 2) {
      local_4f8 = &Logger;
      local_500 = "Optimized WiFi adapter settings for low latency";
      local_238 = &Logger;
      local_23c = 2;
      local_248 = "Optimized WiFi adapter settings for low latency";
      in_stack_fffffffffffffa70 = &Logger;
      local_228 = &Logger;
      local_22c = 2;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_78 = &Logger;
        local_7c = 2;
        local_88 = "Optimized WiFi adapter settings for low latency";
        pCVar2 = &Logger;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,Trace);
        local_68 = &pCVar2->Prefix;
        local_70 = local_88;
        in_stack_fffffffffffffa58 = pCVar2;
        local_60 = local_210;
        local_58 = pCVar2;
        local_50 = local_68;
        local_48 = local_210;
        local_40 = pCVar2;
        local_38 = local_68;
        local_30 = local_210;
        std::operator<<(aoStack_200,(string *)local_68);
        local_20 = local_60;
        local_28 = local_70;
        local_8 = local_60;
        local_10 = local_70;
        local_18 = pCVar2;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        in_stack_fffffffffffffa50 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1baec1);
      }
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffa58);
    if (!bVar1) {
      std::condition_variable::wait_for<long,std::ratio<1l,1l>>
                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffa70);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa50)
    ;
  }
  local_508 = &Logger;
  local_510 = "Quitting: OptimizeWLAN() failed with error ";
  local_518 = local_524;
  local_4d8 = &Logger;
  local_4dc = 4;
  local_4e8 = "Quitting: OptimizeWLAN() failed with error ";
  local_4c8 = &Logger;
  local_4cc = 4;
  if (4 < (int)Logger.ChannelMinLevel) {
    return;
  }
  local_310 = &Logger;
  local_314 = 4;
  local_320 = "Quitting: OptimizeWLAN() failed with error ";
  pCVar2 = &Logger;
  local_4f0 = local_518;
  local_328 = local_518;
  logger::LogStringBuffer::LogStringBuffer
            (in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48,Trace);
  local_2f8 = &((LogStringBuffer *)pCVar2)->field_0x38;
  local_300 = local_320;
  local_308 = local_328;
  this_00 = (LogStringBuffer *)pCVar2;
  local_2f0 = local_4b0;
  local_2e8 = (LogStringBuffer *)pCVar2;
  local_2e0 = local_2f8;
  local_2d8 = local_4b0;
  local_2d0 = (LogStringBuffer *)pCVar2;
  local_2a8 = local_2f8;
  local_2a0 = local_4b0;
  std::operator<<(aoStack_4a0,(string *)local_2f8);
  local_2b8 = local_2f0;
  local_2c0 = local_300;
  local_2c8 = local_308;
  local_290 = local_2f0;
  local_298 = local_300;
  local_260 = local_2f0;
  local_268 = local_300;
  local_2b0 = (LogStringBuffer *)pCVar2;
  local_288 = (LogStringBuffer *)pCVar2;
  std::operator<<((ostream *)(local_2f0 + 0x10),local_300);
  local_278 = local_2b8;
  local_280 = local_2c8;
  local_250 = local_2b8;
  local_258 = local_2c8;
  local_270 = (LogStringBuffer *)pCVar2;
  std::ostream::operator<<((ostream *)(local_2b8 + 0x10),*local_2c8);
  logger::OutputWorker::GetInstance();
  logger::OutputWorker::Write((OutputWorker *)this_00,(LogStringBuffer *)pCVar2);
  logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1bac5f);
  return;
}

Assistant:

void WLANOptimizerThread::Loop()
{
    // Time between optimization attempts.  Retries because WiFi might reconnect.
    static const auto kOptimizeInterval = std::chrono::seconds(11);

    while (!Terminated)
    {
        int optimizeResult = OptimizeWLAN(1);

        // If result was a failure code,
        // and the code was not that no connections were available:
        if (OWLAN_IS_ERROR(optimizeResult))
        {
#ifndef WLANOPT_DISABLE_LOGGING
            Logger.Error("Quitting: OptimizeWLAN() failed with error ", optimizeResult);
#endif // WLANOPT_DISABLE_LOGGING
            // Stop trying to optimize WLAN if we hit an unexpected failure
            break;
        }

#ifndef WLANOPT_DISABLE_LOGGING
        if (optimizeResult == OptimizeWLAN_Applied) {
            Logger.Info("Optimized WiFi adapter settings for low latency");
        }
        else if (optimizeResult == OptimizeWLAN_Preconfigured) {
            //Logger.Debug("Already successfully applied settings");
        }
        else if (optimizeResult == OptimizeWLAN_NoConnections) {
            //Logger.Debug("No WiFi connections available");
        }
#endif // WLANOPT_DISABLE_LOGGING

        // unique_lock used since QueueCondition.wait requires it
        std::unique_lock<std::mutex> locker(WakeLock);

        if (!Terminated) {
            WakeCondition.wait_for(locker, kOptimizeInterval);
        }
    }
}